

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uchar matchHuff(FILE *f,uchar number,uchar ACorDC)

{
  map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
  *this;
  bool bVar1;
  key_type in_RAX;
  ulong uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  undefined7 in_register_00000031;
  int iVar7;
  key_type local_38;
  
  uVar2 = CONCAT71(in_register_00000011,ACorDC) & 0xffffffff;
  uVar5 = CONCAT71(in_register_00000031,number) & 0xffffffff;
  this = huffTable[uVar2] + uVar5;
  iVar7 = 1;
  uVar6 = 0;
  local_38 = in_RAX;
  while( true ) {
    bVar1 = getBit(f);
    uVar6 = (uint)bVar1 + uVar6 * 2;
    local_38.first = (uchar)iVar7;
    local_38.second = uVar6;
    iVar3 = std::
            _Rb_tree<std::pair<unsigned_char,_unsigned_int>,_std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
            ::find(&this->_M_t,&local_38);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &huffTable[uVar2][uVar5]._M_t._M_impl.super__Rb_tree_header) break;
    if (0x10 < iVar7) {
      fwrite("key not found\n",0xe,1,_stderr);
      uVar6 = 0;
      iVar7 = 1;
    }
    iVar7 = iVar7 + 1;
  }
  pmVar4 = std::
           map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
           ::operator[](this,&local_38);
  return *pmVar4;
}

Assistant:

unsigned char matchHuff(FILE *f, unsigned char number, unsigned char ACorDC) {
    unsigned int len = 0;
    unsigned char codeLen;
    for (int count = 1; ; count++) {
        len = len << 1;
        len += (unsigned int)getBit(f);
        if (huffTable[ACorDC][number].find(std::make_pair(count, len)) != huffTable[ACorDC][number].end()) {
            codeLen = huffTable[ACorDC][number][std::make_pair(count, len)];
            return codeLen;
        }
        if (count > 16) {fprintf(stderr, "key not found\n"); count = 1; len = 0;}
    }
}